

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderIntegerFunctionTests.cpp
# Opt level: O0

void __thiscall
vkt::shaderexecutor::BitfieldExtractCaseInstance::getInputValues
          (BitfieldExtractCaseInstance *this,int numValues,void **values)

{
  deUint32 *dst;
  long lVar1;
  long lVar2;
  deUint32 dVar3;
  DataType dataType;
  Precision precision_00;
  int iVar4;
  int iVar5;
  int iVar6;
  const_reference pvVar7;
  bool local_71;
  int offset;
  int local_5c;
  int bits;
  int valueNdx;
  int *inBits;
  int *inOffset;
  deUint32 *inValue;
  int numBits;
  bool ignoreSign;
  Precision precision;
  DataType type;
  Random rnd;
  void **values_local;
  int numValues_local;
  BitfieldExtractCaseInstance *this_local;
  
  rnd.m_rnd._8_8_ = values;
  dVar3 = deStringHash((this->super_IntegerFunctionTestInstance).m_name);
  de::Random::Random((Random *)&precision,dVar3 ^ 0xa113fca2);
  pvVar7 = std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
           operator[](&(this->super_IntegerFunctionTestInstance).m_spec.inputs,0);
  dataType = glu::VarType::getBasicType(&pvVar7->varType);
  pvVar7 = std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
           operator[](&(this->super_IntegerFunctionTestInstance).m_spec.inputs,0);
  precision_00 = glu::VarType::getPrecision(&pvVar7->varType);
  local_71 = false;
  if (precision_00 != PRECISION_HIGHP) {
    local_71 = glu::isDataTypeIntOrIVec(dataType);
  }
  iVar4 = shaderexecutor::anon_unknown_0::getShaderUintBitCount
                    ((this->super_IntegerFunctionTestInstance).m_shaderType,precision_00);
  iVar4 = iVar4 - (uint)(local_71 != false);
  dst = *(deUint32 **)rnd.m_rnd._8_8_;
  lVar1 = *(long *)(rnd.m_rnd._8_8_ + 8);
  lVar2 = *(long *)(rnd.m_rnd._8_8_ + 0x10);
  for (local_5c = 0; local_5c < numValues; local_5c = local_5c + 1) {
    iVar5 = de::Random::getInt((Random *)&precision,0,iVar4);
    iVar6 = de::Random::getInt((Random *)&precision,0,iVar4 - iVar5);
    *(int *)(lVar1 + (long)local_5c * 4) = iVar6;
    *(int *)(lVar2 + (long)local_5c * 4) = iVar5;
  }
  shaderexecutor::anon_unknown_0::generateRandomInputData
            ((Random *)&precision,(this->super_IntegerFunctionTestInstance).m_shaderType,dataType,
             precision_00,dst,numValues);
  de::Random::~Random((Random *)&precision);
  return;
}

Assistant:

void getInputValues (int numValues, void* const* values) const
	{
		de::Random				rnd			(deStringHash(m_name) ^ 0xa113fca2u);
		const glu::DataType		type		= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision	= m_spec.inputs[0].varType.getPrecision();
		const bool				ignoreSign	= precision != glu::PRECISION_HIGHP && glu::isDataTypeIntOrIVec(type);
		const int				numBits		= getShaderUintBitCount(m_shaderType, precision) - (ignoreSign ? 1 : 0);
		deUint32*				inValue		= (deUint32*)values[0];
		int*					inOffset	= (int*)values[1];
		int*					inBits		= (int*)values[2];

		for (int valueNdx = 0; valueNdx < numValues; ++valueNdx)
		{
			const int		bits	= rnd.getInt(0, numBits);
			const int		offset	= rnd.getInt(0, numBits-bits);

			inOffset[valueNdx]	= offset;
			inBits[valueNdx]	= bits;
		}

		generateRandomInputData(rnd, m_shaderType, type, precision, inValue, numValues);
	}